

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  int iVar1;
  Expr *pRight;
  uint uStack_40;
  LogEst iReduce;
  int k;
  int j;
  int i;
  Bitmask notAllowed;
  WhereTerm *pX;
  WhereTerm *pTerm;
  WhereLoop *pWStack_18;
  LogEst nRow_local;
  WhereLoop *pLoop_local;
  WhereClause *pWC_local;
  
  _j = (pLoop->prereq | pLoop->maskSelf) ^ 0xffffffffffffffff;
  pRight._2_2_ = 0;
  k = pWC->nTerm;
  pX = pWC->a;
  pTerm._6_2_ = nRow;
  pWStack_18 = pLoop;
  pLoop_local = (WhereLoop *)pWC;
  do {
    if ((k < 1) || ((pX->wtFlags & 2) != 0)) {
      if ((int)pTerm._6_2_ - (int)pRight._2_2_ < (int)pWStack_18->nOut) {
        pWStack_18->nOut = pTerm._6_2_ - pRight._2_2_;
      }
      return;
    }
    if (((pX->prereqAll & pWStack_18->maskSelf) != 0) && ((pX->prereqAll & _j) == 0)) {
      uStack_40 = (uint)pWStack_18->nLTerm;
      while (uStack_40 = uStack_40 - 1, -1 < (int)uStack_40) {
        notAllowed = (Bitmask)pWStack_18->aLTerm[(int)uStack_40];
        if (((WhereTerm *)notAllowed != (WhereTerm *)0x0) &&
           (((WhereTerm *)notAllowed == pX ||
            ((-1 < ((WhereTerm *)notAllowed)->iParent &&
             ((WhereTerm *)
              (&((pLoop_local->u).btree.pIndex)->zName +
              (long)((WhereTerm *)notAllowed)->iParent * 8) == pX)))))) break;
      }
      if ((int)uStack_40 < 0) {
        if (pX->truthProb < 1) {
          pWStack_18->nOut = pWStack_18->nOut + pX->truthProb;
        }
        else {
          pWStack_18->nOut = pWStack_18->nOut + -1;
          if ((pX->eOperator & 0x82) != 0) {
            iVar1 = sqlite3ExprIsInteger(pX->pExpr->pRight,(int *)((long)&pRight + 4));
            if (((iVar1 == 0) || (pRight._4_4_ < -1)) || (1 < pRight._4_4_)) {
              pRight._4_4_ = 0x14;
            }
            else {
              pRight._4_4_ = 10;
            }
            if (pRight._2_2_ < pRight._4_4_) {
              pRight._2_2_ = (short)pRight._4_4_;
            }
          }
        }
      }
    }
    k = k + -1;
    pX = pX + 1;
  } while( true );
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j, k;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nTerm, pTerm=pWC->a; i>0; i--, pTerm++){
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) break;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( pTerm->eOperator&(WO_EQ|WO_IS) ){
          Expr *pRight = pTerm->pExpr->pRight;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ) iReduce = k;
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce )  pLoop->nOut = nRow - iReduce;
}